

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeDeviceGetP2PPropertiesPrologue
          (ZEParameterValidation *this,ze_device_handle_t hDevice,ze_device_handle_t hPeerDevice,
          ze_device_p2p_properties_t *pP2PProperties)

{
  ze_device_p2p_properties_t *pP2PProperties_local;
  ze_device_handle_t hPeerDevice_local;
  ze_device_handle_t hDevice_local;
  ZEParameterValidation *this_local;
  
  if (hDevice == (ze_device_handle_t)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  else if (hPeerDevice == (ze_device_handle_t)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  else if (pP2PProperties == (ze_device_p2p_properties_t *)0x0) {
    this_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else {
    this_local._4_4_ =
         ParameterValidation::validateExtensions<_ze_device_p2p_properties_t*>(pP2PProperties);
  }
  return this_local._4_4_;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeDeviceGetP2PPropertiesPrologue(
        ze_device_handle_t hDevice,                     ///< [in] handle of the device performing the access
        ze_device_handle_t hPeerDevice,                 ///< [in] handle of the peer device with the allocation
        ze_device_p2p_properties_t* pP2PProperties      ///< [in,out] Peer-to-Peer properties between source and peer device
        )
    {
        if( nullptr == hDevice )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == hPeerDevice )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == pP2PProperties )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        return ParameterValidation::validateExtensions(pP2PProperties);
    }